

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

Status google::protobuf::json_internal::anon_unknown_5::
       ParseTimestamp<google::protobuf::json_internal::ParseProto2Descriptor>
                 (JsonLexer *lex,Desc<google::protobuf::json_internal::ParseProto2Descriptor> *desc,
                 Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg)

{
  char cVar1;
  uint uVar2;
  Msg<google::protobuf::json_internal::ParseProto2Descriptor> *pMVar3;
  Desc<google::protobuf::json_internal::ParseProto2Descriptor> *pDVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Status *x;
  LocationWith<google::protobuf::json_internal::MaybeOwnedString> *pLVar9;
  size_type sVar10;
  uint *puVar11;
  long lVar12;
  const_reference pvVar13;
  Field pFVar14;
  int *piVar15;
  Msg *in_RCX;
  char *in_R8;
  string_view sVar16;
  basic_string_view<char,_std::char_traits<char>_> bVar17;
  string_view end;
  string_view end_00;
  string_view end_01;
  string_view end_02;
  string_view end_03;
  string_view end_04;
  string_view end_05;
  ulong local_468;
  basic_string_view<char,_std::char_traits<char>_> local_2e0;
  ulong local_2d0;
  int64_t offset;
  basic_string_view<char,_std::char_traits<char>_> local_2c0;
  basic_string_view<char,_std::char_traits<char>_> local_2b0;
  _Optional_payload_base<unsigned_int> local_2a0;
  optional<unsigned_int> mins;
  char *local_290;
  _Optional_payload_base<unsigned_int> local_288;
  optional<unsigned_int> hour_1;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  byte local_253;
  undefined1 auStack_250 [5];
  bool neg;
  char *local_248;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  _Optional_payload_base<int> local_228;
  optional<int> nanos;
  int32_t epoch_days;
  uint32_t leap_days;
  uint32_t month_days;
  uint32_t y_adj;
  uint32_t year_base;
  uint32_t carry;
  uint32_t m_adj;
  char *local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  _Optional_payload_base<unsigned_int> local_1dc;
  optional<unsigned_int> sec;
  undefined8 local_1c8;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  _Optional_payload_base<unsigned_int> local_1ac;
  optional<unsigned_int> min;
  undefined8 local_198;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  _Optional_payload_base<unsigned_int> local_17c;
  optional<unsigned_int> hour;
  undefined8 local_168;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  _Optional_payload_base<unsigned_int> local_14c;
  optional<unsigned_int> day;
  undefined8 local_138;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  _Optional_payload_base<unsigned_int> local_11c;
  optional<unsigned_int> mon;
  undefined8 local_108;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  _Optional_payload_base<unsigned_int> local_f0;
  optional<unsigned_int> year;
  int64_t secs;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  undefined1 auStack_c8 [8];
  string_view data;
  undefined1 local_98 [8];
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  str;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  Msg *local_28;
  Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg_local;
  Desc<google::protobuf::json_internal::ParseProto2Descriptor> *desc_local;
  JsonLexer *lex_local;
  Status *_status;
  
  local_28 = in_RCX;
  msg_local = msg;
  desc_local = desc;
  lex_local = lex;
  bVar5 = JsonLexer::Peek((JsonLexer *)desc,kNull);
  pDVar4 = desc_local;
  if (bVar5) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"null");
    JsonLocation::SourceLocation::current();
    JsonLexer::Expect(lex,pDVar4,local_38._M_len,local_38._M_str);
    return (Status)(uintptr_t)lex;
  }
  JsonLexer::ParseUtf8
            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              *)local_98,(JsonLexer *)desc_local);
  x = absl::lts_20240722::
      StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::status((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)local_98);
  absl::lts_20240722::Status::Status((Status *)lex,x);
  bVar5 = absl::lts_20240722::Status::ok((Status *)lex);
  if (((bVar5 ^ 0xffU) & 1) != 0) goto LAB_004b0b40;
  absl::lts_20240722::Status::~Status((Status *)lex);
  pLVar9 = absl::lts_20240722::
           StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
           ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)local_98);
  sVar16 = MaybeOwnedString::AsView(&pLVar9->value);
  data._M_len = (size_t)sVar16._M_str;
  auStack_c8 = (undefined1  [8])sVar16._M_len;
  sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::size
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c8);
  if (sVar10 < 0x14) {
    pLVar9 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)local_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_d8,"timestamp string too short");
    JsonLocation::SourceLocation::current();
    JsonLocation::Invalid((JsonLocation *)lex,&pLVar9->loc,local_d8._M_len,local_d8._M_str);
    goto LAB_004b0b40;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_100,"-");
  sVar16._M_str = in_R8;
  sVar16._M_len = (size_t)local_100._M_str;
  local_f0 = (_Optional_payload_base<unsigned_int>)
             TakeTimeDigitsWithSuffixAndAdvance
                       ((anon_unknown_5 *)auStack_c8,(string_view *)0x4,(int)local_100._M_len,sVar16
                       );
  bVar5 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&local_f0);
  if ((!bVar5) ||
     (puVar11 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_f0),
     *puVar11 == 0)) {
    pLVar9 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)local_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &mon.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged,"bad year in timestamp");
    JsonLocation::SourceLocation::current();
    JsonLocation::Invalid((JsonLocation *)lex,&pLVar9->loc,stack0xfffffffffffffef0,local_108);
    goto LAB_004b0b40;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130,"-");
  end._M_str = in_R8;
  end._M_len = (size_t)local_130._M_str;
  local_11c = (_Optional_payload_base<unsigned_int>)
              TakeTimeDigitsWithSuffixAndAdvance
                        ((anon_unknown_5 *)auStack_c8,(string_view *)0x2,(int)local_130._M_len,end);
  bVar5 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&local_11c);
  if ((!bVar5) ||
     (puVar11 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_11c),
     *puVar11 == 0)) {
    pLVar9 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)local_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &day.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged,"bad month in timestamp");
    JsonLocation::SourceLocation::current();
    JsonLocation::Invalid((JsonLocation *)lex,&pLVar9->loc,stack0xfffffffffffffec0,local_138);
    goto LAB_004b0b40;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160,"T");
  end_00._M_str = in_R8;
  end_00._M_len = (size_t)local_160._M_str;
  local_14c = (_Optional_payload_base<unsigned_int>)
              TakeTimeDigitsWithSuffixAndAdvance
                        ((anon_unknown_5 *)auStack_c8,(string_view *)0x2,(int)local_160._M_len,
                         end_00);
  bVar5 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&local_14c);
  if ((!bVar5) ||
     (puVar11 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_14c),
     *puVar11 == 0)) {
    pLVar9 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)local_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &hour.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged,"bad day in timestamp");
    JsonLocation::SourceLocation::current();
    JsonLocation::Invalid((JsonLocation *)lex,&pLVar9->loc,stack0xfffffffffffffe90,local_168);
    goto LAB_004b0b40;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_190,":");
  end_01._M_str = in_R8;
  end_01._M_len = (size_t)local_190._M_str;
  local_17c = (_Optional_payload_base<unsigned_int>)
              TakeTimeDigitsWithSuffixAndAdvance
                        ((anon_unknown_5 *)auStack_c8,(string_view *)0x2,(int)local_190._M_len,
                         end_01);
  bVar5 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&local_17c);
  if (!bVar5) {
    pLVar9 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)local_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &min.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged,"bad hours in timestamp");
    JsonLocation::SourceLocation::current();
    JsonLocation::Invalid((JsonLocation *)lex,&pLVar9->loc,stack0xfffffffffffffe60,local_198);
    goto LAB_004b0b40;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c0,":");
  end_02._M_str = in_R8;
  end_02._M_len = (size_t)local_1c0._M_str;
  local_1ac = (_Optional_payload_base<unsigned_int>)
              TakeTimeDigitsWithSuffixAndAdvance
                        ((anon_unknown_5 *)auStack_c8,(string_view *)0x2,(int)local_1c0._M_len,
                         end_02);
  bVar5 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&local_1ac);
  if (!bVar5) {
    pLVar9 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)local_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &sec.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged,"bad minutes in timestamp");
    JsonLocation::SourceLocation::current();
    JsonLocation::Invalid((JsonLocation *)lex,&pLVar9->loc,stack0xfffffffffffffe30,local_1c8);
    goto LAB_004b0b40;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f0,"");
  end_03._M_str = in_R8;
  end_03._M_len = (size_t)local_1f0._M_str;
  local_1dc = (_Optional_payload_base<unsigned_int>)
              TakeTimeDigitsWithSuffixAndAdvance
                        ((anon_unknown_5 *)auStack_c8,(string_view *)0x2,(int)local_1f0._M_len,
                         end_03);
  bVar5 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&local_1dc);
  if (!bVar5) {
    pLVar9 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)local_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&m_adj,"bad seconds in timestamp"
              );
    JsonLocation::SourceLocation::current();
    JsonLocation::Invalid((JsonLocation *)lex,&pLVar9->loc,_m_adj,local_1f8);
    goto LAB_004b0b40;
  }
  puVar11 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_11c);
  uVar2 = *puVar11;
  puVar11 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_11c);
  uVar6 = (uint)(*puVar11 < uVar2 - 3);
  puVar11 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_f0);
  uVar7 = (*puVar11 + 0x12c0) - uVar6;
  nanos.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_ =
       ((uVar7 >> 2) - uVar7 / 100) + uVar7 / 400;
  iVar8 = uVar7 * 0x16d +
          nanos.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
          _4_4_;
  puVar11 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_14c);
  nanos.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_payload._M_value =
       (*puVar11 - 0x25bab9) + iVar8 + (((uVar2 - 3) + uVar6 * 0xc) * 0xf4ff + 0x301 >> 0xb);
  lVar12 = (long)nanos.super__Optional_base<int,_true,_true>._M_payload.
                 super__Optional_payload_base<int>._M_payload._M_value;
  puVar11 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_17c);
  uVar2 = *puVar11;
  puVar11 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_1ac);
  uVar6 = *puVar11;
  puVar11 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_1dc);
  year.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)
       (lVar12 * 0x15180 + (ulong)(uVar2 * 0xe10) + (ulong)(uVar6 * 0x3c) + (ulong)*puVar11);
  local_228 = (_Optional_payload_base<int>)TakeNanosAndAdvance((string_view *)auStack_c8);
  bVar5 = std::optional<int>::has_value((optional<int> *)&local_228);
  if (!bVar5) {
    pLVar9 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)local_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_238,"timestamp had bad nanoseconds");
    JsonLocation::SourceLocation::current();
    JsonLocation::Invalid((JsonLocation *)lex,&pLVar9->loc,local_238._M_len,local_238._M_str);
    goto LAB_004b0b40;
  }
  bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c8);
  if (bVar5) {
    pLVar9 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)local_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_250,
               "timestamp missing timezone offset");
    JsonLocation::SourceLocation::current();
    JsonLocation::Invalid((JsonLocation *)lex,&pLVar9->loc,_auStack_250,local_248);
    goto LAB_004b0b40;
  }
  local_253 = 0;
  pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c8,0);
  cVar1 = *pvVar13;
  if (cVar1 == '+') {
LAB_004b0791:
    sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c8);
    if (sVar10 != 6) {
      pLVar9 = absl::lts_20240722::
               StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)local_98);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_268,"timestamp offset of wrong size.");
      JsonLocation::SourceLocation::current();
      JsonLocation::Invalid((JsonLocation *)lex,&pLVar9->loc,local_268._M_len,local_268._M_str);
      goto LAB_004b0b40;
    }
    bVar17 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c8,1,
                        0xffffffffffffffff);
    data._M_len = (size_t)bVar17._M_str;
    hour_1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_base<unsigned_int,_true,_true>)bVar17._M_len;
    auStack_c8 = (undefined1  [8])
                 hour_1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&mins,":");
    end_04._M_str = in_R8;
    end_04._M_len = (size_t)local_290;
    local_288 = (_Optional_payload_base<unsigned_int>)
                TakeTimeDigitsWithSuffixAndAdvance
                          ((anon_unknown_5 *)auStack_c8,(string_view *)0x2,
                           mins.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                           super__Optional_payload_base<unsigned_int>._M_payload._M_value,end_04);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2b0,"");
    end_05._M_str = in_R8;
    end_05._M_len = (size_t)local_2b0._M_str;
    local_2a0 = (_Optional_payload_base<unsigned_int>)
                TakeTimeDigitsWithSuffixAndAdvance
                          ((anon_unknown_5 *)auStack_c8,(string_view *)0x2,(int)local_2b0._M_len,
                           end_05);
    bVar5 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&local_288);
    if ((!bVar5) ||
       (bVar5 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)&local_2a0), !bVar5
       )) {
      pLVar9 = absl::lts_20240722::
               StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)local_98);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2c0,"timestamp offset has bad hours and minutes");
      JsonLocation::SourceLocation::current();
      JsonLocation::Invalid((JsonLocation *)lex,&pLVar9->loc,local_2c0._M_len,local_2c0._M_str);
      goto LAB_004b0b40;
    }
    puVar11 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_288);
    uVar2 = *puVar11;
    puVar11 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_2a0);
    local_2d0 = (ulong)((uVar2 * 0x3c + *puVar11) * 0x3c);
    local_468 = local_2d0;
    if ((local_253 & 1) == 0) {
      local_468 = -local_2d0;
    }
    year.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_base<unsigned_int,_true,_true>)
         (local_468 +
         (long)year.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>);
  }
  else {
    if (cVar1 == '-') {
      local_253 = 1;
      goto LAB_004b0791;
    }
    if ((cVar1 != 'Z') ||
       (sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::size
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c8),
       sVar10 != 1)) {
      pLVar9 = absl::lts_20240722::
               StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             *)local_98);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_2e0,"bad timezone offset");
      JsonLocation::SourceLocation::current();
      JsonLocation::Invalid((JsonLocation *)lex,&pLVar9->loc,local_2e0._M_len,local_2e0._M_str);
      goto LAB_004b0b40;
    }
  }
  pMVar3 = msg_local;
  JsonLocation::SourceLocation::current();
  pFVar14 = Proto2Descriptor::MustHaveField(pMVar3,1);
  ParseProto2Descriptor::SetInt64
            (pFVar14,local_28,
             (int64_t)year.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>);
  pMVar3 = msg_local;
  JsonLocation::SourceLocation::current();
  pFVar14 = Proto2Descriptor::MustHaveField(pMVar3,2);
  piVar15 = std::optional<int>::operator*((optional<int> *)&local_228);
  ParseProto2Descriptor::SetInt32(pFVar14,local_28,*piVar15);
  absl::lts_20240722::OkStatus();
LAB_004b0b40:
  absl::lts_20240722::
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  ::~StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               *)local_98);
  return (Status)(uintptr_t)lex;
}

Assistant:

absl::Status ParseTimestamp(JsonLexer& lex, const Desc<Traits>& desc,
                            Msg<Traits>& msg) {
  if (lex.Peek(JsonLexer::kNull)) {
    return lex.Expect("null");
  }

  absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
  RETURN_IF_ERROR(str.status());

  absl::string_view data = str->value.AsView();
  if (data.size() < 20) {
    return str->loc.Invalid("timestamp string too short");
  }

  int64_t secs;
  {
    /* 1972-01-01T01:00:00 */
    auto year = TakeTimeDigitsWithSuffixAndAdvance(data, 4, "-");
    if (!year.has_value() || *year == 0) {
      return str->loc.Invalid("bad year in timestamp");
    }
    auto mon = TakeTimeDigitsWithSuffixAndAdvance(data, 2, "-");
    if (!mon.has_value() || *mon == 0) {
      return str->loc.Invalid("bad month in timestamp");
    }
    auto day = TakeTimeDigitsWithSuffixAndAdvance(data, 2, "T");
    if (!day.has_value() || *day == 0) {
      return str->loc.Invalid("bad day in timestamp");
    }
    auto hour = TakeTimeDigitsWithSuffixAndAdvance(data, 2, ":");
    if (!hour.has_value()) {
      return str->loc.Invalid("bad hours in timestamp");
    }
    auto min = TakeTimeDigitsWithSuffixAndAdvance(data, 2, ":");
    if (!min.has_value()) {
      return str->loc.Invalid("bad minutes in timestamp");
    }
    auto sec = TakeTimeDigitsWithSuffixAndAdvance(data, 2, "");
    if (!sec.has_value()) {
      return str->loc.Invalid("bad seconds in timestamp");
    }

    uint32_t m_adj = *mon - 3;  // March-based month.
    uint32_t carry = m_adj > *mon ? 1 : 0;

    uint32_t year_base = 4800;  // Before min year, multiple of 400.
    uint32_t y_adj = *year + year_base - carry;

    uint32_t month_days = ((m_adj + carry * 12) * 62719 + 769) / 2048;
    uint32_t leap_days = y_adj / 4 - y_adj / 100 + y_adj / 400;
    int32_t epoch_days =
        y_adj * 365 + leap_days + month_days + (*day - 1) - 2472632;

    secs = int64_t{epoch_days} * 86400 + *hour * 3600 + *min * 60 + *sec;
  }

  auto nanos = TakeNanosAndAdvance(data);
  if (!nanos.has_value()) {
    return str->loc.Invalid("timestamp had bad nanoseconds");
  }

  if (data.empty()) {
    return str->loc.Invalid("timestamp missing timezone offset");
  }

  {
    // [+-]hh:mm or Z
    bool neg = false;
    switch (data[0]) {
      case '-':
        neg = true;
        ABSL_FALLTHROUGH_INTENDED;
      case '+': {
        if (data.size() != 6) {
          return str->loc.Invalid("timestamp offset of wrong size.");
        }

        data = data.substr(1);
        auto hour = TakeTimeDigitsWithSuffixAndAdvance(data, 2, ":");
        auto mins = TakeTimeDigitsWithSuffixAndAdvance(data, 2, "");
        if (!hour.has_value() || !mins.has_value()) {
          return str->loc.Invalid("timestamp offset has bad hours and minutes");
        }

        int64_t offset = (*hour * 60 + *mins) * 60;
        secs += (neg ? offset : -offset);
        break;
      }
      // Lowercase z is not accepted, per the spec.
      case 'Z':
        if (data.size() == 1) {
          break;
        }
        ABSL_FALLTHROUGH_INTENDED;
      default:
        return str->loc.Invalid("bad timezone offset");
    }
  }

  Traits::SetInt64(Traits::MustHaveField(desc, 1), msg, secs);
  Traits::SetInt32(Traits::MustHaveField(desc, 2), msg, *nanos);

  return absl::OkStatus();
}